

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O3

UBool u_isIDPart_63(UChar32 c)

{
  uint uVar1;
  ulong uVar2;
  
  if ((uint)c < 0xd800) {
    uVar1 = (uint)c >> 5;
LAB_0015ce8a:
    uVar2 = (ulong)((c & 0x1fU) + (uint)propsTrie_index[uVar1] * 4);
  }
  else {
    if ((uint)c < 0x10000) {
      uVar1 = ((uint)c >> 5) + 0x140;
      if (0xdbff < (uint)c) {
        uVar1 = (uint)c >> 5;
      }
      goto LAB_0015ce8a;
    }
    uVar2 = 0x11f4;
    if ((uint)c < 0x110000) {
      uVar1 = ((uint)c >> 5 & 0x3f) + (uint)propsTrie_index[(ulong)((uint)c >> 0xb) + 0x820];
      goto LAB_0015ce8a;
    }
  }
  if ((0x40077eU >> ((byte)propsTrie_index[uVar2] & 0x1f) & 1) != 0) {
    return '\x01';
  }
  if (c < 0xa0) {
    if (0x5e < c - 0x20U && (uint)c < 0xa0) {
      return c - 0xeU < 0xe || c - 0x20U < 0xffffffe9;
    }
    return '\0';
  }
  if ((uint)c < 0xd800) {
    uVar1 = (uint)c >> 5;
  }
  else if ((uint)c < 0x10000) {
    uVar1 = ((uint)c >> 5) + 0x140;
    if (0xdbff < (uint)c) {
      uVar1 = (uint)c >> 5;
    }
  }
  else {
    uVar2 = 0x11f4;
    if (0x10ffff < (uint)c) goto LAB_0015cf53;
    uVar1 = ((uint)c >> 5 & 0x3f) + (uint)propsTrie_index[(ulong)((uint)c >> 0xb) + 0x820];
  }
  uVar2 = (ulong)((c & 0x1fU) + (uint)propsTrie_index[uVar1] * 4);
LAB_0015cf53:
  return (propsTrie_index[uVar2] & 0x1f) == 0x10;
}

Assistant:

U_CAPI UBool U_EXPORT2
u_isIDPart(UChar32 c) {
    uint32_t props;
    GET_PROPS(c, props);
    return (UBool)(
           (CAT_MASK(props)&
            (U_GC_ND_MASK|U_GC_NL_MASK|
             U_GC_L_MASK|
             U_GC_PC_MASK|U_GC_MC_MASK|U_GC_MN_MASK)
           )!=0 ||
           u_isIDIgnorable(c));
}